

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dmidtex.cpp
# Opt level: O1

bool P_GetMidTexturePosition(line_t_conflict *line,int sideno,double *ptextop,double *ptexbot)

{
  double dVar1;
  uint uVar2;
  side_t *psVar3;
  FTexture *pFVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if ((line->sidedef[0] != (side_t *)0x0) && (line->sidedef[1] != (side_t *)0x0)) {
    psVar3 = line->sidedef[sideno];
    uVar2 = psVar3->textures[1].texture.texnum;
    if (0 < (long)(int)uVar2) {
      if (uVar2 < TexMan.Textures.Count) {
        pFVar4 = TexMan.Textures.Array[TexMan.Translation.Array[(int)uVar2]].Texture;
      }
      else {
        pFVar4 = (FTexture *)0x0;
      }
      if (pFVar4 == (FTexture *)0x0) {
        return pFVar4 != (FTexture *)0x0;
      }
      dVar6 = ABS(psVar3->textures[1].yScale) * (pFVar4->Scale).Y;
      dVar5 = psVar3->textures[1].yOffset;
      if (((dVar6 != 1.0) || (NAN(dVar6))) && ((pFVar4->field_0x31 & 4) == 0)) {
        dVar5 = dVar5 / dVar6;
      }
      dVar6 = (double)pFVar4->Height / dVar6;
      if ((line->flags & 0x10) == 0) {
        dVar7 = line->frontsector->planes[1].TexZ;
        dVar1 = line->backsector->planes[1].TexZ;
        if (dVar1 <= dVar7) {
          dVar7 = dVar1;
        }
        *ptextop = dVar5 + dVar7;
        *ptexbot = (dVar5 + dVar7) - dVar6;
      }
      else {
        dVar7 = line->frontsector->planes[0].TexZ;
        dVar1 = line->backsector->planes[0].TexZ;
        if (dVar7 <= dVar1) {
          dVar7 = dVar1;
        }
        *ptexbot = dVar5 + dVar7;
        *ptextop = dVar6 + dVar5 + dVar7;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool P_GetMidTexturePosition(const line_t *line, int sideno, double *ptextop, double *ptexbot)
{
	if (line->sidedef[0]==NULL || line->sidedef[1]==NULL) return false;
	
	side_t *side = line->sidedef[sideno];
	FTextureID texnum = side->GetTexture(side_t::mid);
	if (!texnum.isValid()) return false;
	FTexture * tex= TexMan(texnum);
	if (!tex) return false;

	double totalscale = fabs(side->GetTextureYScale(side_t::mid)) * tex->GetScaleY();
	double y_offset = side->GetTextureYOffset(side_t::mid);
	double textureheight = tex->GetHeight() / totalscale;
	if (totalscale != 1. && !tex->bWorldPanning)
	{ 
		y_offset /= totalscale;
	}

	if(line->flags & ML_DONTPEGBOTTOM)
	{
		*ptexbot = y_offset +
			MAX(line->frontsector->GetPlaneTexZ(sector_t::floor), line->backsector->GetPlaneTexZ(sector_t::floor));

		*ptextop = *ptexbot + textureheight;
	}
	else
	{
		*ptextop = y_offset +
		   MIN(line->frontsector->GetPlaneTexZ(sector_t::ceiling), line->backsector->GetPlaneTexZ(sector_t::ceiling));
		
		*ptexbot = *ptextop - textureheight;
	}
	return true;
}